

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::DescriptorProto_ReservedRange::unknown_fields(DescriptorProto_ReservedRange *this)

{
  DescriptorProto_ReservedRange *this_local;
  Container *local_20;
  
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    local_20 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)&this->_internal_metadata_);
  }
  else {
    local_20 = (Container *)internal::InternalMetadataWithArena::default_instance();
  }
  return &local_20->unknown_fields;
}

Assistant:

inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {
    return _internal_metadata_.unknown_fields();
  }